

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

fixup_entry * sort_dir_list(fixup_entry *p)

{
  fixup_entry *p_00;
  int iVar1;
  fixup_entry *pfVar2;
  fixup_entry *local_30;
  fixup_entry *t;
  fixup_entry *b;
  fixup_entry *a;
  fixup_entry *p_local;
  
  if (p == (fixup_entry *)0x0) {
    p_local = (fixup_entry *)0x0;
  }
  else {
    p_local = p;
    if (p->next != (fixup_entry *)0x0) {
      b = p->next->next;
      local_30 = p;
      while (b != (fixup_entry *)0x0) {
        b = b->next;
        if (b != (fixup_entry *)0x0) {
          b = b->next;
        }
        local_30 = local_30->next;
      }
      p_00 = local_30->next;
      local_30->next = (fixup_entry *)0x0;
      pfVar2 = sort_dir_list(p);
      a = sort_dir_list(p_00);
      iVar1 = strcmp(pfVar2->name,a->name);
      if (iVar1 < 1) {
        t = a->next;
        local_30 = a;
        b = pfVar2;
      }
      else {
        local_30 = pfVar2;
        t = a;
        b = pfVar2->next;
        a = pfVar2;
      }
      while (b != (fixup_entry *)0x0 && t != (fixup_entry *)0x0) {
        iVar1 = strcmp(b->name,t->name);
        if (iVar1 < 1) {
          local_30->next = t;
          t = t->next;
        }
        else {
          local_30->next = b;
          b = b->next;
        }
        local_30 = local_30->next;
      }
      if (b != (fixup_entry *)0x0) {
        local_30->next = b;
      }
      if (t != (fixup_entry *)0x0) {
        local_30->next = t;
      }
      p_local = a;
    }
  }
  return p_local;
}

Assistant:

static struct fixup_entry *
sort_dir_list(struct fixup_entry *p)
{
	struct fixup_entry *a, *b, *t;

	if (p == NULL)
		return (NULL);
	/* A one-item list is already sorted. */
	if (p->next == NULL)
		return (p);

	/* Step 1: split the list. */
	t = p;
	a = p->next->next;
	while (a != NULL) {
		/* Step a twice, t once. */
		a = a->next;
		if (a != NULL)
			a = a->next;
		t = t->next;
	}
	/* Now, t is at the mid-point, so break the list here. */
	b = t->next;
	t->next = NULL;
	a = p;

	/* Step 2: Recursively sort the two sub-lists. */
	a = sort_dir_list(a);
	b = sort_dir_list(b);

	/* Step 3: Merge the returned lists. */
	/* Pick the first element for the merged list. */
	if (strcmp(a->name, b->name) > 0) {
		t = p = a;
		a = a->next;
	} else {
		t = p = b;
		b = b->next;
	}

	/* Always put the later element on the list first. */
	while (a != NULL && b != NULL) {
		if (strcmp(a->name, b->name) > 0) {
			t->next = a;
			a = a->next;
		} else {
			t->next = b;
			b = b->next;
		}
		t = t->next;
	}

	/* Only one list is non-empty, so just splice it on. */
	if (a != NULL)
		t->next = a;
	if (b != NULL)
		t->next = b;

	return (p);
}